

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

string * __thiscall XmlRpc::XmlRpcValue::boolToXml_abi_cxx11_(XmlRpcValue *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *xml;
  char *local_50;
  allocator<char> *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  uVar1 = 0;
  this_00 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffee);
  std::__cxx11::string::operator+=((string *)in_RDI,"<boolean>");
  if ((in_RSI->_M_string_length & 1) == 0) {
    local_50 = "0";
  }
  else {
    local_50 = "1";
  }
  std::__cxx11::string::operator+=((string *)in_RDI,local_50);
  std::__cxx11::string::operator+=((string *)in_RDI,"</boolean>");
  std::__cxx11::string::operator+=((string *)in_RDI,"</value>");
  return in_RDI;
}

Assistant:

std::string XmlRpcValue::boolToXml() const
  {
    std::string xml = VALUE_TAG;
    xml += BOOLEAN_TAG;
    xml += (_value.asBool ? "1" : "0");
    xml += BOOLEAN_ETAG;
    xml += VALUE_ETAG;
    return xml;
  }